

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btDbvt.cpp
# Opt level: O0

void __thiscall btDbvt::update(btDbvt *this,btDbvtNode *leaf,int lookahead)

{
  int in_EDX;
  btDbvtNode *in_RSI;
  btDbvtNode *in_RDI;
  bool bVar1;
  btDbvt *unaff_retaddr;
  int i;
  btDbvtNode *root;
  undefined4 in_stack_00000020;
  int local_24;
  btDbvtNode *local_20;
  
  local_20 = removeleaf((btDbvt *)leaf,(btDbvtNode *)CONCAT44(lookahead,in_stack_00000020));
  if ((local_20 != (btDbvtNode *)0x0) && (-1 < in_EDX)) {
    local_24 = 0;
    while( true ) {
      bVar1 = false;
      if (local_24 < in_EDX) {
        bVar1 = local_20->parent != (btDbvtNode *)0x0;
      }
      if (!bVar1) break;
      local_20 = local_20->parent;
      local_24 = local_24 + 1;
    }
  }
  insertleaf(unaff_retaddr,in_RDI,in_RSI);
  return;
}

Assistant:

void			btDbvt::update(btDbvtNode* leaf,int lookahead)
{
	btDbvtNode*	root=removeleaf(this,leaf);
	if(root)
	{
		if(lookahead>=0)
		{
			for(int i=0;(i<lookahead)&&root->parent;++i)
			{
				root=root->parent;
			}
		} else root=m_root;
	}
	insertleaf(this,root,leaf);
}